

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O3

bool __thiscall
glcts::GeometryShaderMaxTextureUnitsTest::verifyResult
          (GeometryShaderMaxTextureUnitsTest *this,void *data)

{
  ostringstream *this_00;
  pointer p_Var1;
  bool bVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  GLint expected_value;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  uVar3 = (ulong)this->m_max_texture_units;
  if (0 < (long)uVar3) {
    p_Var1 = (this->m_textures).
             super__Vector_base<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar12 = false;
    uVar6 = 0;
    do {
      uVar7 = uVar6 + 1;
      iVar5 = ((int)uVar7 * (p_Var1[uVar6].data + p_Var1->data)) / 2;
      iVar10 = 0;
      bVar2 = true;
      do {
        bVar8 = bVar2;
        iVar9 = 0;
        bVar2 = true;
        do {
          bVar4 = bVar2;
          uVar11 = (ulong)((iVar10 * this->m_texture_width + iVar9) * 0x10 + (int)uVar6 * 0x20);
          if (*(int *)((long)data + uVar11) != iVar5) {
            local_1b0._0_8_ =
                 ((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.super_TestCase.
                  super_TestNode.m_testCtx)->m_log;
            this_00 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"Wrong result! Expected: ",0x18);
            std::ostream::operator<<(this_00,iVar5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00," Extracted: ",0xc);
            std::ostream::operator<<(this_00,*(int *)((long)data + uVar11));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," Point: ",8);
            std::ostream::operator<<(this_00,(int)uVar6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," X: ",4);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," Y: ",4);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base(local_138);
            return bVar12;
          }
          iVar9 = 1;
          bVar2 = false;
        } while (bVar4);
        iVar10 = 1;
        bVar2 = false;
      } while (bVar8);
      bVar12 = uVar3 <= uVar7;
      uVar6 = uVar7;
    } while (uVar7 != uVar3);
  }
  return true;
}

Assistant:

bool GeometryShaderMaxTextureUnitsTest::verifyResult(const void* data)
{
	const unsigned char* result_image = (const unsigned char*)data;
	const unsigned int   line_size	= m_texture_width * m_texture_pixel_size;

	/* For each drawn point */
	for (glw::GLint point = 0; point < m_max_texture_units; ++point)
	{
		const glw::GLint   first_value	= m_textures[0].data;
		const glw::GLint   last_value	 = m_textures[point].data;
		const glw::GLint   expected_value = ((first_value + last_value) * (point + 1)) / 2;
		const unsigned int point_offset   = point * m_texture_pixel_size * m_point_size;

		/* Verify all pixels that belong to point, area m_point_size x m_point_size */
		for (unsigned int y = 0; y < m_point_size; ++y)
		{
			const unsigned int line_offset		  = y * line_size;
			const unsigned int first_texel_offset = line_offset + point_offset;

			for (unsigned int x = 0; x < m_point_size; ++x)
			{
				const unsigned int texel_offset = first_texel_offset + x * m_texture_pixel_size;

				if (0 != memcmp(result_image + texel_offset, &expected_value, sizeof(expected_value)))
				{
					glw::GLint* result_value = (glw::GLint*)(result_image + texel_offset);

					m_testCtx.getLog() << tcu::TestLog::Message << "Wrong result! "
																   "Expected: "
									   << expected_value << " Extracted: " << *result_value << " Point: " << point
									   << " X: " << x << " Y: " << y << tcu::TestLog::EndMessage;

					return false;
				}
			}
		}
	}

	return true;
}